

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS
ref_collapse_edge_local_cell(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_INT local_74;
  REF_INT local_70;
  int local_6c;
  REF_INT local_68;
  REF_INT local_64;
  int local_60;
  REF_INT local_5c;
  REF_INT local_58;
  int local_54;
  REF_INT local_50;
  REF_INT local_4c;
  int local_48;
  int local_44;
  REF_INT local_40;
  REF_INT node;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  *allowed = 0;
  pRVar2 = ref_grid->cell[8];
  if ((node1 < 0) || (pRVar2->ref_adj->nnode <= node1)) {
    local_48 = -1;
  }
  else {
    local_48 = pRVar2->ref_adj->first[node1];
  }
  node = local_48;
  if (local_48 == -1) {
    local_4c = -1;
  }
  else {
    local_4c = pRVar2->ref_adj->item[local_48].ref;
  }
  local_40 = local_4c;
  while (node != -1) {
    for (local_44 = 0; local_44 < pRVar2->node_per; local_44 = local_44 + 1) {
      if (pRVar1->ref_mpi->id != pRVar1->part[pRVar2->c2n[local_44 + pRVar2->size_per * local_40]])
      {
        return 0;
      }
    }
    node = pRVar2->ref_adj->item[node].next;
    if (node == -1) {
      local_50 = -1;
    }
    else {
      local_50 = pRVar2->ref_adj->item[node].ref;
    }
    local_40 = local_50;
  }
  if ((node0 < 0) || (pRVar2->ref_adj->nnode <= node0)) {
    local_54 = -1;
  }
  else {
    local_54 = pRVar2->ref_adj->first[node0];
  }
  node = local_54;
  if (local_54 == -1) {
    local_58 = -1;
  }
  else {
    local_58 = pRVar2->ref_adj->item[local_54].ref;
  }
  local_40 = local_58;
  while (node != -1) {
    for (local_44 = 0; local_44 < pRVar2->node_per; local_44 = local_44 + 1) {
      if (pRVar1->ref_mpi->id != pRVar1->part[pRVar2->c2n[local_44 + pRVar2->size_per * local_40]])
      {
        return 0;
      }
    }
    node = pRVar2->ref_adj->item[node].next;
    if (node == -1) {
      local_5c = -1;
    }
    else {
      local_5c = pRVar2->ref_adj->item[node].ref;
    }
    local_40 = local_5c;
  }
  pRVar2 = ref_grid->cell[3];
  if ((node1 < 0) || (pRVar2->ref_adj->nnode <= node1)) {
    local_60 = -1;
  }
  else {
    local_60 = pRVar2->ref_adj->first[node1];
  }
  node = local_60;
  if (local_60 == -1) {
    local_64 = -1;
  }
  else {
    local_64 = pRVar2->ref_adj->item[local_60].ref;
  }
  local_40 = local_64;
  while (node != -1) {
    for (local_44 = 0; local_44 < pRVar2->node_per; local_44 = local_44 + 1) {
      if (pRVar1->ref_mpi->id != pRVar1->part[pRVar2->c2n[local_44 + pRVar2->size_per * local_40]])
      {
        return 0;
      }
    }
    node = pRVar2->ref_adj->item[node].next;
    if (node == -1) {
      local_68 = -1;
    }
    else {
      local_68 = pRVar2->ref_adj->item[node].ref;
    }
    local_40 = local_68;
  }
  if ((node0 < 0) || (pRVar2->ref_adj->nnode <= node0)) {
    local_6c = -1;
  }
  else {
    local_6c = pRVar2->ref_adj->first[node0];
  }
  node = local_6c;
  if (local_6c == -1) {
    local_70 = -1;
  }
  else {
    local_70 = pRVar2->ref_adj->item[local_6c].ref;
  }
  local_40 = local_70;
  do {
    if (node == -1) {
      *allowed = 1;
      return 0;
    }
    for (local_44 = 0; local_44 < pRVar2->node_per; local_44 = local_44 + 1) {
      if (pRVar1->ref_mpi->id != pRVar1->part[pRVar2->c2n[local_44 + pRVar2->size_per * local_40]])
      {
        return 0;
      }
    }
    node = pRVar2->ref_adj->item[node].next;
    if (node == -1) {
      local_74 = -1;
    }
    else {
      local_74 = pRVar2->ref_adj->item[node].ref;
    }
    local_40 = local_74;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_local_cell(REF_GRID ref_grid,
                                                REF_INT node0, REF_INT node1,
                                                REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, node;

  *allowed = REF_FALSE;

  /* may be able to relax node0 local if geom constraint is o.k. */

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }

  /* for parallel surf and twod */
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}